

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void dump_ports_cb(Port *p,char *name,char *param_3,Ports *param_4,void *v,void *param_6)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  iterator __args_1;
  pair<const_char_*,_const_char_*> pVar4;
  bool dumped;
  void *in_stack_00000628;
  char *in_stack_00000630;
  Port *in_stack_00000638;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  char **in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  _Self local_a0 [3];
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  _Self local_38 [7];
  
  if ((dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
       already_dumped_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                                   ::already_dumped_abi_cxx11_), iVar3 != 0)) {
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x10917d);
    __cxa_atexit(std::
                 set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~set,&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                         ::already_dumped_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                         ::already_dumped_abi_cxx11_);
  }
  pVar4 = std::make_pair<char_const*&,char_const*const&>
                    ((char **)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     (char **)in_stack_ffffffffffffff28);
  this = &local_78;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pVar4.second,(pair<const_char_*,_const_char_*> *)pVar4.first);
  __args_1 = std::
             set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(this,(key_type *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  local_38[0]._M_node = __args_1._M_node;
  local_a0[0]._M_node =
       (_Base_ptr)
       std::
       set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_38,local_a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT17(bVar1,in_stack_ffffffffffffff30));
  if (((bVar1 & 1) != 0) &&
     (bVar2 = do_dump_ports(in_stack_00000638,in_stack_00000630,in_stack_00000628), bVar2)) {
    std::
    set<std::pair<std::__cxx11::string,std::__cxx11::string>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace<char_const*&,char_const*const&>
              ((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,(char **)__args_1._M_node);
  }
  return;
}

Assistant:

static void dump_ports_cb(const rtosc::Port *p, const char *name,const char*,
                          const Ports&,void *v, void*)
{
    static std::set<std::pair<std::string, std::string>> already_dumped;
    if(already_dumped.find(std::make_pair(name, p->name)) == already_dumped.end())
    {
        bool dumped = do_dump_ports(p, name, v);
        if(dumped)
            already_dumped.emplace(name, p->name);
    }
}